

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtptcptransmitter.cpp
# Opt level: O0

void __thiscall
jrtplib::RTPTCPTransmitter::DeleteTransmissionInfo(RTPTCPTransmitter *this,RTPTransmissionInfo *i)

{
  RTPMemoryManager *mgr;
  RTPTransmissionInfo *i_local;
  RTPTCPTransmitter *this_local;
  
  if ((this->m_init & 1U) != 0) {
    mgr = RTPMemoryObject::GetMemoryManager((RTPMemoryObject *)this);
    RTPDelete<jrtplib::RTPTransmissionInfo>(i,mgr);
  }
  return;
}

Assistant:

void RTPTCPTransmitter::DeleteTransmissionInfo(RTPTransmissionInfo *i)
{
	if (!m_init)
		return;

	RTPDelete(i, GetMemoryManager());
}